

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

bool __thiscall
llvm::
DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
::LookupBucketFor<DBKeyID>
          (DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
           *this,DBKeyID *Val,DenseMapPair<DBKeyID,_llbuild::core::KeyID> **FoundBucket)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *pDVar5;
  DBKeyID *pDVar6;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *local_80;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *ThisBucket;
  uint ProbeAmt;
  uint BucketNo;
  DBKeyID TombstoneKey;
  DBKeyID EmptyKey;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *FoundTombstone;
  uint NumBuckets;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *BucketsPtr;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> **FoundBucket_local;
  DBKeyID *Val_local;
  DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
  *this_local;
  
  pDVar5 = getBuckets(this);
  uVar3 = getNumBuckets(this);
  if (uVar3 == 0) {
    *FoundBucket = (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)0x0;
    this_local._7_1_ = false;
  }
  else {
    EmptyKey.value = 0;
    TombstoneKey = getEmptyKey();
    _ProbeAmt = getTombstoneKey();
    bVar1 = DenseMapInfo<DBKeyID>::isEqual(Val,&TombstoneKey);
    bVar2 = false;
    if (!bVar1) {
      bVar1 = DenseMapInfo<DBKeyID>::isEqual(Val,(DBKeyID *)&ProbeAmt);
      bVar2 = false;
      if (!bVar1) {
        bVar2 = true;
      }
    }
    if (!bVar2) {
      __assert_fail("!KeyInfoT::isEqual(Val, EmptyKey) && !KeyInfoT::isEqual(Val, TombstoneKey) && \"Empty/Tombstone value shouldn\'t be inserted into map!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                    ,0x24d,
                    "bool llvm::DenseMapBase<llvm::DenseMap<DBKeyID, llbuild::core::KeyID>, DBKeyID, llbuild::core::KeyID, llvm::DenseMapInfo<DBKeyID>, llvm::detail::DenseMapPair<DBKeyID, llbuild::core::KeyID>>::LookupBucketFor(const LookupKeyT &, const BucketT *&) const [DerivedT = llvm::DenseMap<DBKeyID, llbuild::core::KeyID>, KeyT = DBKeyID, ValueT = llbuild::core::KeyID, KeyInfoT = llvm::DenseMapInfo<DBKeyID>, BucketT = llvm::detail::DenseMapPair<DBKeyID, llbuild::core::KeyID>, LookupKeyT = DBKeyID]"
                   );
    }
    uVar4 = getHashValue(Val);
    ThisBucket._4_4_ = uVar4 & uVar3 - 1;
    ThisBucket._0_4_ = 1;
    while( true ) {
      local_80 = pDVar5 + ThisBucket._4_4_;
      pDVar6 = detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>::getFirst(local_80);
      bVar2 = DenseMapInfo<DBKeyID>::isEqual(Val,pDVar6);
      if (bVar2) break;
      pDVar6 = detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>::getFirst(local_80);
      bVar2 = DenseMapInfo<DBKeyID>::isEqual(pDVar6,&TombstoneKey);
      if (bVar2) {
        if (EmptyKey.value != 0) {
          local_80 = (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)EmptyKey.value;
        }
        *FoundBucket = local_80;
        return false;
      }
      pDVar6 = detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>::getFirst(local_80);
      bVar2 = DenseMapInfo<DBKeyID>::isEqual(pDVar6,(DBKeyID *)&ProbeAmt);
      if ((bVar2) && (EmptyKey.value == 0)) {
        EmptyKey.value = (uint64_t)local_80;
      }
      ThisBucket._4_4_ = uVar3 - 1 & (int)ThisBucket + ThisBucket._4_4_;
      ThisBucket._0_4_ = (int)ThisBucket + 1;
    }
    *FoundBucket = local_80;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool LookupBucketFor(const LookupKeyT &Val,
                       const BucketT *&FoundBucket) const {
    const BucketT *BucketsPtr = getBuckets();
    const unsigned NumBuckets = getNumBuckets();

    if (NumBuckets == 0) {
      FoundBucket = nullptr;
      return false;
    }

    // FoundTombstone - Keep track of whether we find a tombstone while probing.
    const BucketT *FoundTombstone = nullptr;
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    assert(!KeyInfoT::isEqual(Val, EmptyKey) &&
           !KeyInfoT::isEqual(Val, TombstoneKey) &&
           "Empty/Tombstone value shouldn't be inserted into map!");

    unsigned BucketNo = getHashValue(Val) & (NumBuckets-1);
    unsigned ProbeAmt = 1;
    while (true) {
      const BucketT *ThisBucket = BucketsPtr + BucketNo;
      // Found Val's bucket?  If so, return it.
      if (LLVM_LIKELY(KeyInfoT::isEqual(Val, ThisBucket->getFirst()))) {
        FoundBucket = ThisBucket;
        return true;
      }

      // If we found an empty bucket, the key doesn't exist in the set.
      // Insert it and return the default value.
      if (LLVM_LIKELY(KeyInfoT::isEqual(ThisBucket->getFirst(), EmptyKey))) {
        // If we've already seen a tombstone while probing, fill it in instead
        // of the empty bucket we eventually probed to.
        FoundBucket = FoundTombstone ? FoundTombstone : ThisBucket;
        return false;
      }

      // If this is a tombstone, remember it.  If Val ends up not in the map, we
      // prefer to return it than something that would require more probing.
      if (KeyInfoT::isEqual(ThisBucket->getFirst(), TombstoneKey) &&
          !FoundTombstone)
        FoundTombstone = ThisBucket;  // Remember the first tombstone found.

      // Otherwise, it's a hash collision or a tombstone, continue quadratic
      // probing.
      BucketNo += ProbeAmt++;
      BucketNo &= (NumBuckets-1);
    }
  }